

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# excp_helper.c
# Opt level: O3

void raise_interrupt2(CPUX86State *env,int intno,int is_int,int error_code,int next_eip_addend,
                     uintptr_t retaddr)

{
  int iVar1;
  uint uVar2;
  
  if (is_int != 0) {
    cpu_svm_check_intercept_param_x86_64(env,0x75,0,retaddr);
    goto LAB_00507300;
  }
  cpu_svm_check_intercept_param_x86_64(env,intno + 0x40,(long)error_code,retaddr);
  iVar1 = env->old_exception;
  if (iVar1 == 0) {
    if (0xe < (uint)intno) goto LAB_00507300;
    if ((0x3c01U >> (intno & 0x1fU) & 1) != 0) goto LAB_005072cb;
    uVar2 = 0x4100;
LAB_005072f3:
    if ((uVar2 >> (intno & 0x1fU) & 1) == 0) goto LAB_00507300;
  }
  else {
    if (iVar1 == 8) {
      if ((env->hflags & 0x200000) != 0) {
        cpu_vmexit_x86_64(env,0x7f,0,retaddr);
      }
      qemu_system_reset_request((uc_struct *)env->uc);
      intno = 0x10001;
      goto LAB_00507300;
    }
    if (3 < intno - 10U && intno != 0 || 3 < iVar1 - 10U) {
      if (iVar1 != 0xe) {
        if (0xe < (uint)intno) goto LAB_00507300;
        uVar2 = 0x7d01;
        goto LAB_005072f3;
      }
      if (4 < intno - 10U) {
        if (intno == 8) goto LAB_005072f9;
        if (intno != 0) goto LAB_00507300;
      }
    }
LAB_005072cb:
    intno = 8;
    error_code = 0;
  }
LAB_005072f9:
  env->old_exception = intno;
LAB_00507300:
  *(int *)((long)env[-1].hi16_zmm_regs + 0x3f0) = intno;
  env->error_code = error_code;
  env->exception_is_int = is_int;
  env->exception_next_eip = (long)next_eip_addend + env->eip;
  cpu_loop_exit_restore_x86_64((CPUState *)(env[-6].mtrr_var + 4),retaddr);
}

Assistant:

static void QEMU_NORETURN raise_interrupt2(CPUX86State *env, int intno,
                                           int is_int, int error_code,
                                           int next_eip_addend,
                                           uintptr_t retaddr)
{
    CPUState *cs = env_cpu(env);

    if (!is_int) {
        cpu_svm_check_intercept_param(env, SVM_EXIT_EXCP_BASE + intno,
                                      error_code, retaddr);
        intno = check_exception(env, intno, &error_code, retaddr);
    } else {
        cpu_svm_check_intercept_param(env, SVM_EXIT_SWINT, 0, retaddr);
    }

    cs->exception_index = intno;
    env->error_code = error_code;
    env->exception_is_int = is_int;
    env->exception_next_eip = env->eip + next_eip_addend;
    cpu_loop_exit_restore(cs, retaddr);
}